

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu_Type.cxx
# Opt level: O0

void __thiscall Fl_Menu_Item_Type::write_code1(Fl_Menu_Item_Type *this)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  bool bVar5;
  char *local_58;
  int local_40;
  int n;
  int init;
  char *ut;
  char *cn;
  char *c;
  char *mname;
  Fl_Menu_Item_Type *pFStack_10;
  int i;
  Fl_Menu_Item_Type *this_local;
  
  pFStack_10 = this;
  pcVar2 = menu_name(this,(int *)((long)&mname + 4));
  iVar1 = (*((this->super_Fl_Widget_Type).super_Fl_Type.prev)->_vptr_Fl_Type[0x1e])();
  if (iVar1 == 0) {
    pcVar3 = Fl_Type::class_name((Fl_Type *)this,1);
    if (pcVar3 == (char *)0x0) {
      if (i18n_type != 0) {
        write_h("extern unsigned char %s_i18n_done;\n",pcVar2);
      }
      write_h("extern Fl_Menu_Item %s[];\n",pcVar2);
    }
    else {
      if (i18n_type != 0) {
        write_h("  static unsigned char %s_i18n_done;\n",pcVar2);
      }
      write_h("  static Fl_Menu_Item %s[];\n",pcVar2);
    }
  }
  pcVar3 = array_name(&this->super_Fl_Widget_Type);
  if (pcVar3 != (char *)0x0) {
    pcVar4 = Fl_Type::class_name((Fl_Type *)this,1);
    if (pcVar4 == (char *)0x0) {
      pcVar4 = Fl_Type::name((Fl_Type *)this);
      if (pcVar3 == pcVar4) {
        write_h("#define %s (%s+%d)\n",pcVar3,pcVar2,(ulong)mname._4_4_);
      }
      else {
        write_h("extern Fl_Menu_Item *%s;\n",pcVar3);
      }
    }
    else {
      write_public((this->super_Fl_Widget_Type).public_);
      write_h("  static Fl_Menu_Item *%s;\n",pcVar3);
    }
  }
  pcVar3 = Fl_Type::callback((Fl_Type *)this);
  if (pcVar3 != (char *)0x0) {
    pcVar3 = Fl_Type::callback((Fl_Type *)this);
    iVar1 = is_name(pcVar3);
    if ((iVar1 == 0) && (pcVar3 = Fl_Type::class_name((Fl_Type *)this,1), pcVar3 != (char *)0x0)) {
      pcVar3 = Fl_Type::callback_name((Fl_Type *)this);
      pcVar4 = Fl_Type::user_data_type((Fl_Type *)this);
      if (pcVar4 == (char *)0x0) {
        local_58 = "void*";
      }
      else {
        local_58 = Fl_Type::user_data_type((Fl_Type *)this);
      }
      write_public(0);
      write_h("  inline void %s_i(Fl_Menu_*, %s);\n",pcVar3,local_58);
      write_h("  static void %s(Fl_Menu_*, %s);\n",pcVar3,local_58);
    }
  }
  pcVar3 = Fl_Type::name((Fl_Type *)this);
  if (pcVar3 != (char *)0x0) {
    pcVar3 = Fl_Type::name((Fl_Type *)this);
    pcVar3 = strchr(pcVar3,0x5b);
    if (pcVar3 != (char *)0x0) {
      pcVar3 = indent();
      pcVar4 = Fl_Type::name((Fl_Type *)this);
      write_c("%s%s = &%s[%d];\n",pcVar3,pcVar4,pcVar2,(ulong)mname._4_4_);
    }
  }
  bVar5 = (this->super_Fl_Widget_Type).image != (Fluid_Image *)0x0;
  if (bVar5) {
    pcVar3 = indent();
    write_c("%s{ Fl_Menu_Item* o = &%s[%d];\n",pcVar3,pcVar2,(ulong)mname._4_4_);
    Fluid_Image::write_code((this->super_Fl_Widget_Type).image,"o",0);
  }
  for (local_40 = 0; local_40 < 4; local_40 = local_40 + 1) {
    pcVar3 = Fl_Widget_Type::extra_code(&this->super_Fl_Widget_Type,local_40);
    if (pcVar3 != (char *)0x0) {
      pcVar3 = Fl_Widget_Type::extra_code(&this->super_Fl_Widget_Type,local_40);
      iVar1 = isdeclare(pcVar3);
      if (iVar1 == 0) {
        if (!bVar5) {
          bVar5 = true;
          pcVar3 = indent();
          write_c("%s{ Fl_Menu_Item* o = &%s[%d];\n",pcVar3,pcVar2,(ulong)mname._4_4_);
        }
        pcVar3 = indent();
        pcVar4 = Fl_Widget_Type::extra_code(&this->super_Fl_Widget_Type,local_40);
        write_c("%s  %s\n",pcVar3,pcVar4);
      }
    }
  }
  if (bVar5) {
    pcVar2 = indent();
    write_c("%s}\n",pcVar2);
  }
  return;
}

Assistant:

void Fl_Menu_Item_Type::write_code1() {
  int i; const char* mname = menu_name(i);

  if (!prev->is_menu_item()) {
    // for first menu item, declare the array
    if (class_name(1)) {
      if (i18n_type) write_h("  static unsigned char %s_i18n_done;\n", mname);
      write_h("  static Fl_Menu_Item %s[];\n", mname);
    } else {
      if (i18n_type) write_h("extern unsigned char %s_i18n_done;\n", mname);
      write_h("extern Fl_Menu_Item %s[];\n", mname);
    }
  }

  const char *c = array_name(this);
  if (c) {
    if (class_name(1)) {
      write_public(public_);
      write_h("  static Fl_Menu_Item *%s;\n", c);
    } else {
      if (c==name())
        write_h("#define %s (%s+%d)\n", c, mname, i);
      else
        write_h("extern Fl_Menu_Item *%s;\n", c);
    }
  }

  if (callback()) {
    if (!is_name(callback()) && class_name(1)) {
      const char* cn = callback_name();
      const char* ut = user_data_type() ? user_data_type() : "void*";
      write_public(0);
      write_h("  inline void %s_i(Fl_Menu_*, %s);\n", cn, ut);
      write_h("  static void %s(Fl_Menu_*, %s);\n", cn, ut);
    }
  }

  int init = 0;
  // if the name is an array variable, assign the value here
  if (name() && strchr(name(), '[')) {
    write_c("%s%s = &%s[%d];\n", indent(), name(), mname, i);
  }
  if (image) {
    if (!init) {
      init = 1;
      write_c("%s{ Fl_Menu_Item* o = &%s[%d];\n", indent(), mname, i);
    }
    image->write_code("o");
  }
  for (int n=0; n < NUM_EXTRA_CODE; n++)
    if (extra_code(n) && !isdeclare(extra_code(n))) {
      if (!init) {
	init = 1;
	write_c("%s{ Fl_Menu_Item* o = &%s[%d];\n", indent(), mname, i);
      }
      write_c("%s  %s\n", indent(), extra_code(n));
    }
  if (init) write_c("%s}\n",indent());
}